

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getBasis(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VarStatus *rows,VarStatus *cols,int rowsSize,int colsSize)

{
  int iVar1;
  uint uVar2;
  VarStatus *pVVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  iVar1 = (this->m_rBasisStat).thesize;
  pVVar3 = (this->m_rBasisStat).data;
  for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    rows[lVar6] = pVVar3[lVar6];
  }
  uVar2 = (this->m_cBasisStat).thesize;
  pVVar3 = (this->m_cBasisStat).data;
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    cols[uVar5] = pVVar3[uVar5];
  }
  return;
}

Assistant:

virtual void getBasis(typename SPxSolverBase<R>::VarStatus rows[],
                         typename SPxSolverBase<R>::VarStatus cols[], const int rowsSize = -1, const int colsSize = -1) const
   {
      assert(m_postsolved);
      assert(rowsSize < 0 || rowsSize >= m_rBasisStat.size());
      assert(colsSize < 0 || colsSize >= m_cBasisStat.size());

      for(int i = 0; i < m_rBasisStat.size(); ++i)
         rows[i] = m_rBasisStat[i];

      for(int j = 0; j < m_cBasisStat.size(); ++j)
         cols[j] = m_cBasisStat[j];
   }